

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode EndpointsHandshake(UA_Client *client)

{
  bool bVar1;
  bool bVar2;
  UA_Boolean UVar3;
  long lVar4;
  UA_UserTokenPolicy *src;
  UA_UserTokenPolicy *userToken;
  size_t j;
  UA_EndpointDescription *endpoint;
  size_t i;
  UA_String binaryTransport;
  UA_String securityNone;
  UA_Boolean tokenFound;
  UA_Boolean endpointFound;
  UA_EndpointDescription *pUStack_28;
  UA_StatusCode retval;
  size_t endpointArraySize;
  UA_EndpointDescription *endpointArray;
  UA_Client *client_local;
  
  endpointArraySize = 0;
  pUStack_28 = (UA_EndpointDescription *)0x0;
  endpointArray = (UA_EndpointDescription *)client;
  securityNone.data._4_4_ =
       GetEndpoints(client,(size_t *)&stack0xffffffffffffffd8,
                    (UA_EndpointDescription **)&endpointArraySize);
  client_local._4_4_ = securityNone.data._4_4_;
  if (securityNone.data._4_4_ == 0) {
    bVar1 = false;
    bVar2 = false;
    join_0x00000010_0x00000000_ = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    _i = UA_STRING("http://opcfoundation.org/UA-Profile/Transport/uatcp-uasc-uabinary");
    for (endpoint = (UA_EndpointDescription *)0x0; endpoint < pUStack_28;
        endpoint = (UA_EndpointDescription *)((long)&(endpoint->endpointUrl).length + 1)) {
      lVar4 = endpointArraySize + (long)endpoint * 0xd8;
      if (((*(long *)(lVar4 + 0xc0) == 0) ||
          (UVar3 = UA_String_equal((UA_String *)(lVar4 + 0xc0),(UA_String *)&i), UVar3)) &&
         (UVar3 = UA_String_equal((UA_String *)(lVar4 + 0xa0),(UA_String *)&binaryTransport.data),
         UVar3)) {
        bVar1 = true;
        for (userToken = (UA_UserTokenPolicy *)0x0;
            userToken < *(UA_UserTokenPolicy **)(lVar4 + 0xb0);
            userToken = (UA_UserTokenPolicy *)((long)&(userToken->policyId).length + 1)) {
          src = (UA_UserTokenPolicy *)(*(long *)(lVar4 + 0xb8) + (long)userToken * 0x48);
          if ((((src->securityPolicyUri).length == 0) ||
              (UVar3 = UA_String_equal(&src->securityPolicyUri,(UA_String *)&binaryTransport.data),
              UVar3)) && (*(UA_UserTokenType *)&endpointArray[2].endpointUrl.data == src->tokenType)
             ) {
            bVar2 = true;
            UA_UserTokenPolicy_copy
                      (src,(UA_UserTokenPolicy *)&endpointArray[2].server.applicationName);
            break;
          }
        }
      }
    }
    UA_Array_delete((void *)endpointArraySize,(size_t)pUStack_28,UA_TYPES + 0x9b);
    if (bVar1) {
      if (!bVar2) {
        UA_LOG_ERROR((UA_Logger)(endpointArray->server).applicationUri.length,UA_LOGCATEGORY_CLIENT,
                     "No suitable UserTokenPolicy found for the possible endpoints");
        securityNone.data._4_4_ = 0x80020000;
      }
    }
    else {
      UA_LOG_ERROR((UA_Logger)(endpointArray->server).applicationUri.length,UA_LOGCATEGORY_CLIENT,
                   "No suitable endpoint found");
      securityNone.data._4_4_ = 0x80020000;
    }
    client_local._4_4_ = securityNone.data._4_4_;
  }
  return client_local._4_4_;
}

Assistant:

static UA_StatusCode
EndpointsHandshake(UA_Client *client) {
    UA_EndpointDescription* endpointArray = NULL;
    size_t endpointArraySize = 0;
    UA_StatusCode retval = GetEndpoints(client, &endpointArraySize, &endpointArray);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    UA_Boolean endpointFound = false;
    UA_Boolean tokenFound = false;
    UA_String securityNone = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    UA_String binaryTransport = UA_STRING("http://opcfoundation.org/UA-Profile/"
                                          "Transport/uatcp-uasc-uabinary");

    //TODO: compare endpoint information with client->endpointUri
    for(size_t i = 0; i < endpointArraySize; ++i) {
        UA_EndpointDescription* endpoint = &endpointArray[i];
        /* look out for binary transport endpoints */
        /* Note: Siemens returns empty ProfileUrl, we will accept it as binary */
        if(endpoint->transportProfileUri.length != 0 &&
           !UA_String_equal(&endpoint->transportProfileUri, &binaryTransport))
            continue;
        /* look out for an endpoint without security */
        if(!UA_String_equal(&endpoint->securityPolicyUri, &securityNone))
            continue;
        
        /* endpoint with no security found */
        endpointFound = true;
       
        /* look for a user token policy with an anonymous token */
        for(size_t j = 0; j < endpoint->userIdentityTokensSize; ++j) {
            UA_UserTokenPolicy* userToken = &endpoint->userIdentityTokens[j];

            /* Usertokens also have a security policy... */
            if(userToken->securityPolicyUri.length > 0 &&
               !UA_String_equal(&userToken->securityPolicyUri, &securityNone))
                continue;

            /* UA_CLIENTAUTHENTICATION_NONE == UA_USERTOKENTYPE_ANONYMOUS
             * UA_CLIENTAUTHENTICATION_USERNAME == UA_USERTOKENTYPE_USERNAME
             * TODO: Check equivalence for other types when adding the support */
            if((int)client->authenticationMethod != (int)userToken->tokenType)
                continue;

            /* Endpoint with matching usertokenpolicy found */
            tokenFound = true;
            UA_UserTokenPolicy_copy(userToken, &client->token);
            break;
        }
    }

    UA_Array_delete(endpointArray, endpointArraySize,
                    &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);

    if(!endpointFound) {
        UA_LOG_ERROR(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "No suitable endpoint found");
        retval = UA_STATUSCODE_BADINTERNALERROR;
    } else if(!tokenFound) {
        UA_LOG_ERROR(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "No suitable UserTokenPolicy found for the possible endpoints");
        retval = UA_STATUSCODE_BADINTERNALERROR;
    }
    return retval;
}